

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

ostream * __thiscall nivalis::DrawBufferObject::to_bin(DrawBufferObject *this,ostream *os)

{
  array<double,_2UL> val;
  size_type sVar1;
  long lVar2;
  ostream *in_RSI;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *in_RDI;
  int i_1;
  size_t i;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  float in_stack_ffffffffffffff9c;
  undefined4 uVar4;
  ostream *in_stack_ffffffffffffffa0;
  ostream *poVar5;
  undefined4 local_2c;
  undefined8 local_18;
  
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size(in_RDI);
  util::write_bin<unsigned_long>
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size
                      (in_RDI);
    if (sVar1 <= local_18) break;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (in_RDI,local_18);
    val._M_elems[0]._4_4_ = in_stack_ffffffffffffff9c;
    val._M_elems[0]._0_4_ = in_stack_ffffffffffffff98;
    val._M_elems[1] = (double)in_stack_ffffffffffffffa0;
    util::write_bin<std::array<double,2ul>>((ostream *)0x13c52e,val);
    local_18 = local_18 + 1;
  }
  util::write_bin<float>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    util::write_bin<float>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  util::write_bin<unsigned_long>
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  util::write_bin<nivalis::DrawBufferObject::_unnamed_type_1_>
            (in_stack_ffffffffffffffa0,(anon_enum_32)in_stack_ffffffffffffff9c);
  uVar3 = SUB84(in_RSI,0);
  uVar4 = (undefined4)((ulong)in_RSI >> 0x20);
  std::__cxx11::string::size();
  util::write_bin<unsigned_long>(in_stack_ffffffffffffffa0,CONCAT44(uVar4,uVar3));
  poVar5 = in_RSI;
  lVar2 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::ostream::write((char *)poVar5,lVar2);
  return in_RSI;
}

Assistant:

std::ostream& DrawBufferObject::to_bin(std::ostream& os) const {
    util::write_bin(os, points.size());
    for (size_t i = 0; i < points.size(); ++i) {
        util::write_bin(os, points[i]);
    }
    util::write_bin(os, thickness);
    for (int i = 0; i < 4; ++i) util::write_bin(os, c.data[i]);
    util::write_bin(os, rel_func);
    util::write_bin(os, type);
    util::write_bin(os, str.size());
    os.write(str.c_str(), str.size());
    return os;
}